

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O1

string * __thiscall
spirv_cross::CompilerMSL::to_qualifiers_glsl_abi_cxx11_
          (string *__return_storage_ptr__,CompilerMSL *this,uint32_t id)

{
  Variant *pVVar1;
  int iVar2;
  ulong uVar3;
  SPIRVariable *pSVar4;
  SPIRType *pSVar5;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  uVar3 = (ulong)id;
  if ((uVar3 < (this->super_CompilerGLSL).super_Compiler.ir.ids.
               super_VectorView<spirv_cross::Variant>.buffer_size) &&
     (pVVar1 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
               super_VectorView<spirv_cross::Variant>.ptr, pVVar1[uVar3].type == TypeVariable)) {
    pSVar4 = Variant::get<spirv_cross::SPIRVariable>(pVVar1 + uVar3);
  }
  else {
    pSVar4 = (SPIRVariable *)0x0;
  }
  pSVar5 = Compiler::expression_type((Compiler *)this,id);
  if (pSVar5->storage == StorageClassTaskPayloadWorkgroupEXT) {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  if (pSVar5->storage != StorageClassWorkgroup) {
    if (pSVar4 == (SPIRVariable *)0x0) {
      return __return_storage_ptr__;
    }
    iVar2 = (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x1c])(this,pSVar4,4);
    if ((char)iVar2 == '\0') {
      return __return_storage_ptr__;
    }
  }
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

string CompilerMSL::to_qualifiers_glsl(uint32_t id)
{
	string quals;

	auto *var = maybe_get<SPIRVariable>(id);
	auto &type = expression_type(id);

	if (type.storage == StorageClassTaskPayloadWorkgroupEXT)
		quals += "object_data ";

	if (type.storage == StorageClassWorkgroup || (var && variable_decl_is_remapped_storage(*var, StorageClassWorkgroup)))
		quals += "threadgroup ";

	return quals;
}